

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece.h
# Opt level: O0

string * __thiscall
StringPiece::AsString_abi_cxx11_(string *__return_storage_ptr__,StringPiece *this)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_19;
  StringPiece *local_18;
  StringPiece *this_local;
  
  local_18 = this;
  this_local = (StringPiece *)__return_storage_ptr__;
  if (this->len_ == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    pcVar1 = this->str_;
    uVar2 = this->len_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,uVar2,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AsString() const {
    return len_ ? std::string(str_, len_) : std::string();
  }